

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestReporterStdout.cpp
# Opt level: O0

void __thiscall
UnitTest::TestReporterStdout::ReportSummary
          (TestReporterStdout *this,int totalTestCount,int failedTestCount,int failureCount,
          float secondsElapsed)

{
  float secondsElapsed_local;
  int failureCount_local;
  int failedTestCount_local;
  int totalTestCount_local;
  TestReporterStdout *this_local;
  
  if (failureCount < 1) {
    printf("Success: %d tests passed.\n",(ulong)(uint)totalTestCount);
  }
  else {
    printf("FAILURE: %d out of %d tests failed (%d failures).\n",(ulong)(uint)failedTestCount,
           (ulong)(uint)totalTestCount,(ulong)(uint)failureCount);
  }
  printf("Test time: %.2f seconds.\n",(double)secondsElapsed);
  return;
}

Assistant:

void TestReporterStdout::ReportSummary(int const totalTestCount, int const failedTestCount,
                                       int const failureCount, float secondsElapsed)
{
	using namespace std;

    if (failureCount > 0)
        printf("FAILURE: %d out of %d tests failed (%d failures).\n", failedTestCount, totalTestCount, failureCount);
    else
        printf("Success: %d tests passed.\n", totalTestCount);

    printf("Test time: %.2f seconds.\n", secondsElapsed);
}